

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O3

SearchFilesResult *
Diligent::LinuxFileSystem::Search(SearchFilesResult *__return_storage_ptr__,Char *SearchPattern)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *__file;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  string FileName;
  glob_t glob_result;
  stat StatBuff;
  allocator local_159;
  SearchFilesResult *local_158;
  String local_150;
  FindFileData local_130;
  glob_t local_108;
  stat local_c0;
  
  (__return_storage_ptr__->
  super__Vector_base<Diligent::FindFileData,_std::allocator<Diligent::FindFileData>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Diligent::FindFileData,_std::allocator<Diligent::FindFileData>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Diligent::FindFileData,_std::allocator<Diligent::FindFileData>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.gl_stat = (_func_4978 *)0x0;
  local_108.gl_opendir = (_func_4976 *)0x0;
  local_108.gl_lstat = (_func_4977 *)0x0;
  local_108.gl_closedir = (_func_4974 *)0x0;
  local_108.gl_readdir = (_func_4975 *)0x0;
  local_108.gl_offs = 0;
  local_108.gl_flags = 0;
  local_108._28_4_ = 0;
  local_108.gl_pathc = 0;
  local_108.gl_pathv = (char **)0x0;
  local_158 = __return_storage_ptr__;
  iVar4 = glob(SearchPattern,0x1000,(__errfunc *)0x0,&local_108);
  if ((iVar4 == 0) && (local_108.gl_pathc != 0)) {
    paVar1 = &local_150.field_2;
    paVar2 = &local_130.Name.field_2;
    uVar5 = 0;
    uVar6 = 1;
    do {
      __file = local_108.gl_pathv[uVar5];
      memset(&local_c0,0,0x90);
      stat(__file,&local_c0);
      local_150._M_string_length = 0;
      local_150.field_2._M_local_buf[0] = '\0';
      local_150._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::string((string *)&local_130,__file,&local_159);
      BasicFileSystem::GetPathComponents(&local_130.Name,(String *)0x0,&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.Name._M_dataplus._M_p != paVar2) {
        operator_delete(local_130.Name._M_dataplus._M_p,
                        local_130.Name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p == paVar1) {
        local_130.Name.field_2._8_8_ = local_150.field_2._8_8_;
        local_130.Name._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_130.Name._M_dataplus._M_p = local_150._M_dataplus._M_p;
      }
      local_130.Name.field_2._M_allocated_capacity._1_7_ =
           local_150.field_2._M_allocated_capacity._1_7_;
      local_130.Name.field_2._M_local_buf[0] = local_150.field_2._M_local_buf[0];
      local_130.Name._M_string_length = local_150._M_string_length;
      local_150._M_string_length = 0;
      local_150.field_2._M_local_buf[0] = '\0';
      local_130.IsDirectory = (local_c0.st_mode & 0xf000) == 0x4000;
      local_150._M_dataplus._M_p = (pointer)paVar1;
      std::vector<Diligent::FindFileData,_std::allocator<Diligent::FindFileData>_>::
      emplace_back<Diligent::FindFileData>(local_158,&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.Name._M_dataplus._M_p != paVar2) {
        operator_delete(local_130.Name._M_dataplus._M_p,
                        local_130.Name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != paVar1) {
        operator_delete(local_150._M_dataplus._M_p,
                        CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                 local_150.field_2._M_local_buf[0]) + 1);
      }
      bVar3 = uVar6 < local_108.gl_pathc;
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar3);
  }
  globfree(&local_108);
  return local_158;
}

Assistant:

LinuxFileSystem::SearchFilesResult LinuxFileSystem::Search(const Char* SearchPattern)
{
    LinuxFileSystem::SearchFilesResult SearchRes;

#if PLATFORM_LINUX || PLATFORM_APPLE
    glob_t glob_result = {};
    if (glob(SearchPattern, GLOB_TILDE, NULL, &glob_result) == 0)
    {
        for (unsigned int i = 0; i < glob_result.gl_pathc; ++i)
        {
            const auto* path = glob_result.gl_pathv[i];

            struct stat StatBuff = {};
            stat(path, &StatBuff);

            std::string FileName;
            GetPathComponents(path, nullptr, &FileName);
            SearchRes.emplace_back(FindFileData{std::move(FileName), S_ISDIR(StatBuff.st_mode)});
        }
    }
    globfree(&glob_result);
#else
    UNSUPPORTED("Not implemented");
#endif

    return SearchRes;
}